

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O0

Vec_Int_t * Gia_PolynCoreCollect(Gia_Man_t *pGia,Vec_Int_t *vAdds,Vec_Int_t *vOrder)

{
  int iVar1;
  int iVar2;
  int i_00;
  int i_01;
  Vec_Int_t *vNodes_00;
  Vec_Bit_t *p;
  int Entry3;
  int Entry2;
  int Entry1;
  int Index;
  int i;
  Vec_Bit_t *vVisited;
  Vec_Int_t *vNodes;
  Vec_Int_t *vOrder_local;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *pGia_local;
  
  vNodes_00 = Vec_IntAlloc(1000);
  iVar1 = Gia_ManObjNum(pGia);
  p = Vec_BitStart(iVar1);
  Entry1 = Vec_IntSize(vOrder);
  while (Entry1 = Entry1 + -1, -1 < Entry1) {
    iVar1 = Vec_IntEntry(vOrder,Entry1);
    iVar2 = Vec_IntEntry(vAdds,iVar1 * 6);
    i_00 = Vec_IntEntry(vAdds,iVar1 * 6 + 1);
    i_01 = Vec_IntEntry(vAdds,iVar1 * 6 + 2);
    Vec_BitWriteEntry(p,iVar2,1);
    Vec_BitWriteEntry(p,i_00,1);
    Vec_BitWriteEntry(p,i_01,1);
    iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 3);
    iVar1 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
    Gia_PolynCoreCollect_rec(pGia,iVar2,vNodes_00,p);
    Gia_PolynCoreCollect_rec(pGia,iVar1,vNodes_00,p);
  }
  Vec_BitFree(p);
  return vNodes_00;
}

Assistant:

Vec_Int_t * Gia_PolynCoreCollect( Gia_Man_t * pGia, Vec_Int_t * vAdds, Vec_Int_t * vOrder )
{
    Vec_Int_t * vNodes = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vVisited = Vec_BitStart( Gia_ManObjNum(pGia) );
    int i, Index, Entry1, Entry2, Entry3;
    Vec_IntForEachEntryReverse( vOrder, Index, i )
    {
        // mark inputs
        Entry1 = Vec_IntEntry( vAdds, 6*Index + 0 );
        Entry2 = Vec_IntEntry( vAdds, 6*Index + 1 );
        Entry3 = Vec_IntEntry( vAdds, 6*Index + 2 );
        Vec_BitWriteEntry( vVisited, Entry1, 1 );
        Vec_BitWriteEntry( vVisited, Entry2, 1 );
        Vec_BitWriteEntry( vVisited, Entry3, 1 );
        // traverse from outputs
        Entry1 = Vec_IntEntry( vAdds, 6*Index + 3 );
        Entry2 = Vec_IntEntry( vAdds, 6*Index + 4 );
        Gia_PolynCoreCollect_rec( pGia, Entry1, vNodes, vVisited );
        Gia_PolynCoreCollect_rec( pGia, Entry2, vNodes, vVisited );
    }
    Vec_BitFree( vVisited );
    return vNodes;
}